

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall tinyusdz::Attribute::set_var(Attribute *this,PrimVar *v)

{
  string local_40;
  
  if ((this->_type_name)._M_string_length == 0) {
    primvar::PrimVar::type_name_abi_cxx11_(&local_40,v);
    ::std::__cxx11::string::operator=((string *)&this->_type_name,(string *)&local_40);
    ::std::__cxx11::string::_M_dispose();
  }
  primvar::PrimVar::operator=(&this->_var,v);
  return;
}

Assistant:

void set_var(primvar::PrimVar &&v) {
    if (_type_name.empty()) {
      _type_name = v.type_name();
    }

    _var = std::move(v);
  }